

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O3

void __thiscall
enact::ParametricTypename::ParametricTypename
          (ParametricTypename *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *constructorTypename,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *parameterTypenames)

{
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *parameterTypename;
  pointer puVar4;
  string separator;
  ostringstream name;
  char *local_1f8;
  char *local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  ParametricTypename *local_1d0;
  string local_1c8;
  undefined7 uStack_1c7;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__ParametricTypename_00127908;
  (this->m_constructorTypename)._M_t.
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl =
       (constructorTypename->_M_t).
       super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>.
       _M_t.
       super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
       super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl;
  (constructorTypename->_M_t).
  super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
  super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
  super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl = (Typename *)0x0;
  puVar4 = (parameterTypenames->
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_parameterTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parameterTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_parameterTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar4;
  (this->m_parameterTypenames).
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parameterTypenames->
       super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parameterTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (parameterTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parameterTypenames->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_1d8;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  local_1d0 = this;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_1f8 = &local_1e8;
  local_1f0 = (char *)0x0;
  local_1e8 = '\0';
  iVar2 = (*((this->m_constructorTypename)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  local_1c8 = (string)0x5b;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
  puVar4 = (this->m_parameterTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_parameterTypenames).
           super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f8,(long)local_1f0);
      iVar2 = (*((puVar4->_M_t).
                 super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                 .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->
                _vptr_Typename[4])();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,*(char **)CONCAT44(extraout_var_00,iVar2),
                 ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1]);
      std::__cxx11::string::_M_replace((ulong)&local_1f8,0,local_1f0,0x11d1ad);
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  local_1c8 = (string)0x5d;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1c8,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_name,&local_1c8);
  if ((long *)CONCAT71(uStack_1c7,local_1c8) != local_1b8) {
    operator_delete((long *)CONCAT71(uStack_1c7,local_1c8),local_1b8[0] + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

ParametricTypename::ParametricTypename(
            std::unique_ptr<const Typename> constructorTypename,
            std::vector<std::unique_ptr<const Typename> > parameterTypenames) :
            m_constructorTypename{std::move(constructorTypename)},
            m_parameterTypenames{std::move(parameterTypenames)},
            m_name{} {
        std::ostringstream name;
        std::string separator;

        name << m_constructorTypename->name() << '[';
        for (const auto& parameterTypename : m_parameterTypenames) {
            name << separator << parameterTypename->name();
            separator = ", ";
        }
        name << ']';

        m_name = name.str();
    }